

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectStore.cpp
# Opt level: O0

ObjectStoreToken * __thiscall ObjectStore::newToken(ObjectStore *this,ByteString *label)

{
  vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_> *this_00;
  MutexLocker *this_01;
  uchar *in_RDI;
  ObjectStoreToken *newToken;
  ByteString serial;
  string serialNumber;
  string tokenUUID;
  MutexLocker lock;
  Mutex *in_stack_fffffffffffffeb8;
  MutexLocker *pMVar1;
  MutexLocker *in_stack_fffffffffffffec0;
  string *__x;
  ByteString *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  string local_100 [32];
  ByteString *in_stack_ffffffffffffff20;
  ByteString *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff34;
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [48];
  string local_40 [64];
  
  MutexLocker::MutexLocker(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  UUID::newUUID_abi_cxx11_();
  std::__cxx11::string::substr((ulong)local_90,(ulong)local_40);
  std::__cxx11::string::substr((ulong)local_b0,(ulong)local_40);
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  __x = local_70;
  this_00 = (vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_> *)
            std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  ByteString::ByteString(in_stack_fffffffffffffee0,in_RDI,(size_t)this_00);
  std::__cxx11::string::string(local_100,(string *)(in_RDI + 0x38));
  std::__cxx11::string::string((string *)&stack0xfffffffffffffee0,local_40);
  this_01 = (MutexLocker *)
            ObjectStoreToken::createToken
                      (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34
                       ,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
  std::__cxx11::string::~string(local_100);
  pMVar1 = this_01;
  if (this_01 != (MutexLocker *)0x0) {
    std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>::push_back
              (this_00,(value_type *)__x);
    std::vector<ObjectStoreToken_*,_std::allocator<ObjectStoreToken_*>_>::push_back
              (this_00,(value_type *)__x);
  }
  ByteString::~ByteString((ByteString *)0x1d9903);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_40);
  MutexLocker::~MutexLocker(this_01);
  return (ObjectStoreToken *)pMVar1;
}

Assistant:

ObjectStoreToken* ObjectStore::newToken(const ByteString& label)
{
	MutexLocker lock(storeMutex);

	// Generate a UUID for the token
	std::string tokenUUID = UUID::newUUID();

	// Convert the UUID to a serial number
	std::string serialNumber = tokenUUID.substr(19, 4) + tokenUUID.substr(24);
	ByteString serial((const unsigned char*) serialNumber.c_str(), serialNumber.size());

	// Create the token
	ObjectStoreToken* newToken = ObjectStoreToken::createToken(storePath, tokenUUID, umask, label, serial);

	if (newToken != NULL)
	{
		tokens.push_back(newToken);
		allTokens.push_back(newToken);
	}

	return newToken;
}